

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreeAddressCode.cpp
# Opt level: O0

void MyCompiler::traverseIdentsFactor
               (Factor *ast,
               unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *usedIdents)

{
  int iVar1;
  element_type *ast_00;
  element_type *peVar2;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *usedIdents_local;
  Factor *ast_local;
  
  iVar1 = (ast->super_AbstractAstNode).caseNum;
  if (iVar1 == 0) {
    peVar2 = std::__shared_ptr_access<MyCompiler::Ident,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MyCompiler::Ident,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&ast->pIdent);
    std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(usedIdents,&(peVar2->super_AbstractAstNode).value);
  }
  else if (iVar1 == 2) {
    ast_00 = std::
             __shared_ptr_access<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<MyCompiler::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&ast->pExpression);
    traverseIdentsExpression(ast_00,usedIdents);
  }
  return;
}

Assistant:

void MyCompiler::traverseIdentsFactor(MyCompiler::Factor &ast,
                                      std::unordered_set<std::string> &usedIdents)
{
    switch (ast.caseNum)
    {
        case 2:
            return traverseIdentsExpression(*ast.pExpression, usedIdents);
        case 0:
            usedIdents.insert(ast.pIdent->value);
    }
}